

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::initSlowCase(APInt *this,uint64_t val,bool isSigned)

{
  uint uVar1;
  uint i;
  uint64_t *__s;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->BitWidth;
  uVar3 = (ulong)uVar1 + 0x3f >> 6;
  uVar2 = (ulong)(uint)((int)uVar3 * 8);
  __s = (uint64_t *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  (this->U).pVal = __s;
  *__s = val;
  if (((long)val < 0 && isSigned) && 0x40 < (ulong)uVar1) {
    uVar2 = 1;
    do {
      (this->U).pVal[uVar2] = 0xffffffffffffffff;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::initSlowCase(uint64_t val, bool isSigned) {
  U.pVal = getClearedMemory(getNumWords());
  U.pVal[0] = val;
  if (isSigned && int64_t(val) < 0)
    for (unsigned i = 1; i < getNumWords(); ++i)
      U.pVal[i] = WORD_MAX;
  clearUnusedBits();
}